

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t exr_attr_set_float(exr_context_t ctxt,int part_index,char *name,float val)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  exr_result_t eVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_context_t nonc;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_38;
  
  if (name != (char *)0x0) {
    iVar1 = strcmp(name,"pixelAspectRatio");
    if (iVar1 == 0) {
      eVar2 = exr_set_pixel_aspect_ratio(ctxt,part_index,val);
      return eVar2;
    }
    iVar1 = strcmp(name,"screenWindowWidth");
    if (iVar1 == 0) {
      eVar2 = exr_set_screen_window_width(ctxt,part_index,val);
      return eVar2;
    }
  }
  local_38 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar2 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar2;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar2 = 0x15;
LAB_00120ee9:
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar2);
    return eVar2;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar2 = 8;
    goto LAB_00120ee9;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar2 = exr_attr_list_find_by_name(ctxt,list,name,&local_38);
  if (eVar2 == 0) {
    eVar2 = 0;
    if (local_38->type != EXR_ATTR_FLOAT) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar2 = (*ctxt->print_error)
                        (ctxt,0x10,
                         "\'%s\' requested type \'f\', but stored attributes is type \'%s\'",name,
                         local_38->type_name);
      return eVar2;
    }
  }
  else {
    if (eVar2 != 0xf) goto LAB_00120f7a;
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0xf;
    }
    eVar2 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_FLOAT,0,(uint8_t **)0x0,&local_38);
  }
  if (eVar2 == 0) {
    (local_38->field_6).f = val;
  }
LAB_00120f7a:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_float (
    exr_context_t ctxt, int part_index, const char* name, float val)
{
    if (name && 0 == strcmp (name, EXR_REQ_PAR_STR))
        return exr_set_pixel_aspect_ratio (ctxt, part_index, val);
    if (name && 0 == strcmp (name, EXR_REQ_SCR_WW_STR))
        return exr_set_screen_window_width (ctxt, part_index, val);

    {
        ATTR_SET_IMPL (EXR_ATTR_FLOAT, f);
    }
}